

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_0.c
# Opt level: O1

void crypto_sign_ed25519_ref10_fe_0(int32_t *h)

{
  h[4] = 0;
  h[5] = 0;
  h[6] = 0;
  h[7] = 0;
  h[0] = 0;
  h[1] = 0;
  h[2] = 0;
  h[3] = 0;
  h[8] = 0;
  h[9] = 0;
  return;
}

Assistant:

void fe_0(fe h)
{
  h[0] = 0;
  h[1] = 0;
  h[2] = 0;
  h[3] = 0;
  h[4] = 0;
  h[5] = 0;
  h[6] = 0;
  h[7] = 0;
  h[8] = 0;
  h[9] = 0;
}